

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O1

ModuleHeaderSyntax * __thiscall slang::parsing::Parser::parseModuleHeader(Parser *this)

{
  Token name;
  bool bVar1;
  int iVar2;
  SyntaxKind kind;
  ulong uVar3;
  SourceLocation *pSVar4;
  SourceLocation parameters;
  SourceLocation SVar5;
  NonAnsiPortSyntax *pNVar6;
  undefined4 extraout_var;
  SourceLocation SVar7;
  ModuleHeaderSyntax *pMVar8;
  SourceLocation in_RCX;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  Info *extraout_RDX_01;
  Info *extraout_RDX_02;
  Info *src;
  Info *extraout_RDX_03;
  TokenKind TVar9;
  Token TVar10;
  Token TVar11;
  span<slang::syntax::PackageImportDeclarationSyntax_*,_18446744073709551615UL> sVar12;
  SourceRange range;
  Token dot;
  Token moduleKeyword;
  Token lifetime;
  Token closeParen;
  SmallVector<slang::syntax::TokenOrSyntax,_8UL> buffer;
  Token local_1f0;
  Token local_1e0;
  SourceLocation local_1d0;
  Token local_1c8;
  Info *local_1b8;
  SourceLocation *local_1b0;
  Info *local_1a8;
  undefined8 local_1a0;
  Info *local_198;
  undefined8 local_190;
  Info *local_188;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_180;
  ulong local_170;
  undefined8 uStack_168;
  undefined8 local_158;
  Token local_148;
  undefined8 local_138;
  Info *pIStack_130;
  Token local_128;
  Token local_118;
  undefined1 local_108 [24];
  undefined1 auStack_f0 [24];
  __extent_storage<18446744073709551615UL> local_d8;
  
  TVar10 = ParserBase::consume(&this->super_ParserBase);
  local_188 = TVar10.info;
  uVar3 = TVar10._0_8_;
  TVar11 = parseLifetime(this);
  local_198 = TVar11.info;
  local_190 = TVar11._0_8_;
  TVar11 = ParserBase::expect(&this->super_ParserBase,Identifier);
  local_1a8 = TVar11.info;
  local_1a0 = TVar11._0_8_;
  sVar12 = parsePackageImports(this);
  local_1b8 = (Info *)sVar12._M_extent._M_extent_value;
  pSVar4 = (SourceLocation *)sVar12._M_ptr;
  parameters = (SourceLocation)parseParameterPortList(this);
  bVar1 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
  if (bVar1) {
    local_1c8 = ParserBase::consume(&this->super_ParserBase);
    bVar1 = ParserBase::peek(&this->super_ParserBase,Dot);
    if ((bVar1) && (TVar11 = ParserBase::peek(&this->super_ParserBase,1), TVar11.kind == Star)) {
      TVar11 = ParserBase::consume(&this->super_ParserBase);
      local_1d0 = TVar11._0_8_;
      local_118 = ParserBase::consume(&this->super_ParserBase);
      local_128 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
      dot.info = TVar11.info;
      dot._0_8_ = local_1d0;
      in_RCX = local_1d0;
      SVar5 = (SourceLocation)
              slang::syntax::SyntaxFactory::wildcardPortList
                        (&this->factory,local_1c8,dot,local_118,local_128);
    }
    else {
      bVar1 = isNonAnsiPort(this);
      if (bVar1) {
        Token::Token(&local_1f0);
        local_108._8_8_ = 0;
        local_108._0_8_ = auStack_f0;
        local_108._16_8_ = (SyntaxNode *)0x8;
        local_1e0 = ParserBase::peek(&this->super_ParserBase);
        bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(local_1e0.kind);
        if (bVar1) {
          bVar1 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
          if (!bVar1) {
            SVar5 = Token::location(&local_1e0);
            ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x480005,SVar5);
          }
          local_1f0 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
LAB_0039f0c6:
          src = local_1f0.info;
        }
        else {
          bVar1 = slang::syntax::SyntaxFacts::isPossibleNonAnsiPort(local_1e0.kind);
          if (bVar1) {
            do {
              local_1d0 = parameters;
              pNVar6 = parseNonAnsiPort(this);
              local_180._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pNVar6;
              local_170 = CONCAT71(local_170._1_7_,1);
              SmallVectorBase<slang::syntax::TokenOrSyntax>::
              emplace_back<slang::syntax::TokenOrSyntax>
                        ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_108,
                         (TokenOrSyntax *)&local_180._M_first);
              TVar11 = ParserBase::peek(&this->super_ParserBase);
              TVar9 = TVar11.kind;
              bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar9);
              iVar2 = 3;
              src = extraout_RDX;
              if (TVar9 != EndOfFile && !bVar1) {
                if (TVar9 != Comma) {
                  ParserBase::expect(&this->super_ParserBase,Comma);
                  do {
                    bVar1 = ParserBase::
                            skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleNonAnsiPort,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                      (&this->super_ParserBase,(DiagCode)0x480005,false);
                    if (!bVar1) {
                      local_1f0 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
                      src = local_1f0.info;
                      iVar2 = 1;
                      goto LAB_0039f275;
                    }
                    bVar1 = ParserBase::peek(&this->super_ParserBase,Comma);
                  } while (!bVar1);
                }
                local_180._M_first._M_storage =
                     (_Uninitialized<slang::parsing::Token,_true>)
                     ParserBase::expect(&this->super_ParserBase,Comma);
                local_170 = local_170 & 0xffffffffffffff00;
                SmallVectorBase<slang::syntax::TokenOrSyntax>::
                emplace_back<slang::syntax::TokenOrSyntax>
                          ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_108,
                           (TokenOrSyntax *)&local_180._M_first);
                TVar11 = ParserBase::peek(&this->super_ParserBase);
                TVar9 = TVar11.kind;
                bVar1 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar9);
                if (TVar9 == EndOfFile || bVar1) {
                  pNVar6 = parseNonAnsiPort(this);
                  local_180._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pNVar6;
                  local_170 = CONCAT71(local_170._1_7_,1);
                  SmallVectorBase<slang::syntax::TokenOrSyntax>::
                  emplace_back<slang::syntax::TokenOrSyntax>
                            ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_108,
                             (TokenOrSyntax *)&local_180._M_first);
                  src = extraout_RDX_01;
                }
                else {
                  src = extraout_RDX_00;
                  if (((local_1e0.kind != TVar9) || (local_1e0.info != TVar11.info)) ||
                     (bVar1 = ParserBase::
                              skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleNonAnsiPort,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                        (&this->super_ParserBase,(DiagCode)0x480005,true),
                     src = extraout_RDX_02, bVar1)) {
                    iVar2 = 0;
                    local_1e0 = TVar11;
                  }
                }
              }
LAB_0039f275:
              parameters = local_1d0;
            } while (iVar2 == 0);
            if (iVar2 == 3) {
              local_1f0 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
              goto LAB_0039f0c6;
            }
          }
          else {
            ParserBase::reportMissingList
                      (&this->super_ParserBase,local_1e0,CloseParenthesis,&local_1f0,
                       (DiagCode)0x480005);
            src = extraout_RDX_03;
          }
        }
        iVar2 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                          ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)local_108,
                           (EVP_PKEY_CTX *)(this->super_ParserBase).alloc,(EVP_PKEY_CTX *)src);
        local_158 = CONCAT44(extraout_var,iVar2);
        in_RCX = (SourceLocation)&local_180;
        local_180._8_4_ = 3;
        local_170 = 0;
        uStack_168 = 0;
        local_180._M_rest =
             (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_005d62e8;
        SVar5 = (SourceLocation)
                slang::syntax::SyntaxFactory::nonAnsiPortList
                          (&this->factory,local_1c8,
                           (SeparatedSyntaxList<slang::syntax::NonAnsiPortSyntax> *)in_RCX,local_1f0
                          );
        if ((pointer)local_108._0_8_ != (pointer)auStack_f0) {
          operator_delete((void *)local_108._0_8_);
        }
      }
      else {
        SVar5 = (SourceLocation)parseAnsiPortList(this,local_1c8);
      }
    }
  }
  else {
    SVar5 = (SourceLocation)0x0;
  }
  range.endLoc = in_RCX;
  range.startLoc = (SourceLocation)(uVar3 & 0xffff);
  local_1b0 = pSVar4;
  if ((int)(uVar3 & 0xffff) != 0xe8) {
    if ((parameters == (SourceLocation)0x0 && SVar5 == (SourceLocation)0x0) &&
        local_1b8 != (Info *)0x0) {
      local_108._0_16_ = (undefined1  [16])ParserBase::peek(&this->super_ParserBase);
      SVar7 = Token::location((Token *)local_108);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x4e0005,SVar7);
    }
    goto LAB_0039f3d7;
  }
  if (local_1b8 == (Info *)0x0) {
    SVar7 = parameters;
    if ((parameters != (SourceLocation)0x0) || (SVar7 = SVar5, SVar5 != (SourceLocation)0x0))
    goto LAB_0039f3b0;
    bVar1 = false;
  }
  else {
    SVar7 = *pSVar4;
LAB_0039f3b0:
    range = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)SVar7);
    bVar1 = true;
  }
  if (bVar1) {
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x700005,range);
  }
LAB_0039f3d7:
  TVar11 = ParserBase::expect(&this->super_ParserBase,Semicolon);
  kind = slang::syntax::SyntaxFacts::getModuleHeaderKind(TVar10.kind);
  local_138 = local_1a0;
  pIStack_130 = local_1a8;
  local_108._8_4_ = 1;
  local_108._16_8_ = (SyntaxNode *)0x0;
  auStack_f0._0_8_ = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)0x0;
  auStack_f0._8_8_ = local_1b8;
  auStack_f0._16_8_ = local_1b0;
  local_d8._M_extent_value = (size_t)local_1b8;
  local_108._0_8_ = &PTR_getChild_005d6260;
  name.info = local_1a8;
  name.kind = (undefined2)local_1a0;
  name._2_1_ = local_1a0._2_1_;
  name.numFlags.raw = local_1a0._3_1_;
  name.rawLen = local_1a0._4_4_;
  moduleKeyword.info = local_188;
  moduleKeyword.kind = (short)uVar3;
  moduleKeyword._2_1_ = (char)(uVar3 >> 0x10);
  moduleKeyword.numFlags.raw = (char)(uVar3 >> 0x18);
  moduleKeyword.rawLen = (int)(uVar3 >> 0x20);
  lifetime.info = local_198;
  lifetime.kind = (undefined2)local_190;
  lifetime._2_1_ = local_190._2_1_;
  lifetime.numFlags.raw = local_190._3_1_;
  lifetime.rawLen = local_190._4_4_;
  local_148 = TVar11;
  pMVar8 = slang::syntax::SyntaxFactory::moduleHeader
                     (&this->factory,kind,moduleKeyword,lifetime,name,
                      (SyntaxList<slang::syntax::PackageImportDeclarationSyntax> *)local_108,
                      (ParameterPortListSyntax *)parameters,(PortListSyntax *)SVar5,TVar11);
  return pMVar8;
}

Assistant:

ModuleHeaderSyntax& Parser::parseModuleHeader() {
    auto moduleKeyword = consume();
    auto lifetime = parseLifetime();
    auto name = expect(TokenKind::Identifier);
    auto imports = parsePackageImports();
    auto parameterList = parseParameterPortList();

    PortListSyntax* ports = nullptr;
    if (peek(TokenKind::OpenParenthesis)) {
        auto openParen = consume();
        if (peek(TokenKind::Dot) && peek(1).kind == TokenKind::Star) {
            auto dot = consume();
            auto star = consume();
            ports = &factory.wildcardPortList(openParen, dot, star,
                                              expect(TokenKind::CloseParenthesis));
        }
        else if (isNonAnsiPort()) {
            Token closeParen;
            SmallVector<TokenOrSyntax, 8> buffer;
            parseList<isPossibleNonAnsiPort, isEndOfParenList>(
                buffer, TokenKind::CloseParenthesis, TokenKind::Comma, closeParen,
                RequireItems::True, diag::ExpectedNonAnsiPort,
                [this] { return &parseNonAnsiPort(); }, AllowEmpty::True);
            ports = &factory.nonAnsiPortList(openParen, buffer.copy(alloc), closeParen);
        }
        else {
            ports = &parseAnsiPortList(openParen);
        }
    }

    if (moduleKeyword.kind == TokenKind::PackageKeyword) {
        std::optional<SourceRange> errorRange;
        if (!imports.empty())
            errorRange = imports[0]->sourceRange();
        else if (parameterList)
            errorRange = parameterList->sourceRange();
        else if (ports)
            errorRange = ports->sourceRange();

        if (errorRange)
            addDiag(diag::InvalidPackageDecl, *errorRange);
    }
    else if (!imports.empty() && !parameterList && !ports) {
        addDiag(diag::ExpectedPortList, peek().location());
    }

    auto semi = expect(TokenKind::Semicolon);
    return factory.moduleHeader(getModuleHeaderKind(moduleKeyword.kind), moduleKeyword, lifetime,
                                name, imports, parameterList, ports, semi);
}